

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O2

Object * __thiscall
ObjTable<QPDFWriter::Object>::element(ObjTable<QPDFWriter::Object> *this,size_t idx)

{
  pointer pOVar1;
  int iVar2;
  long lVar3;
  mapped_type *pmVar4;
  runtime_error *this_00;
  size_t idx_local;
  
  idx_local = idx;
  if (element(unsigned_long)::max_size == '\0') {
    iVar2 = __cxa_guard_acquire(&element(unsigned_long)::max_size);
    if (iVar2 != 0) {
      element::max_size = 0xaaaaaaaaaaaaaaa;
      __cxa_guard_release(&element(unsigned_long)::max_size);
    }
  }
  pOVar1 = (this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pOVar1;
  if (idx_local < (ulong)(lVar3 / 0xc)) {
    pmVar4 = pOVar1 + idx_local;
  }
  else {
    if (element::max_size <= idx_local) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10,idx_local,lVar3 % 0xc);
      std::runtime_error::runtime_error
                (this_00,"Impossibly large object id encountered accessing ObjTable");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pmVar4 = std::
             map<unsigned_long,_QPDFWriter::Object,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
             ::at(&this->sparse_elements,&idx_local);
  }
  return pmVar4;
}

Assistant:

inline T const&
    element(size_t idx) const
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < std::vector<T>::size()) {
            return std::vector<T>::operator[](idx);
        }
        if (idx < max_size) {
            return sparse_elements.at(idx);
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }